

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Organya.cpp
# Opt level: O0

BOOL LoadOrganya(char *name)

{
  BOOL BVar1;
  char *name_local;
  
  if (audio_backend_initialised) {
    BVar1 = OrgData::InitMusicData(&org_data,name);
    if (BVar1) {
      Volume = 100;
      bFadeout = false;
      name_local._7_1_ = true;
    }
    else {
      printf("Audio Data failed to initalize!\n");
      name_local._7_1_ = false;
    }
  }
  else {
    printf("Audio backend failed to initalize!\n");
    name_local._7_1_ = false;
  }
  return name_local._7_1_;
}

Assistant:

BOOL LoadOrganya(const char *name)
{
	if (!audio_backend_initialised) {
		printf("Audio backend failed to initalize!\n");
		return FALSE;
	}

	if (!org_data.InitMusicData(name)) {
		printf("Audio Data failed to initalize!\n");
		return FALSE;
	}

	Volume = 100;
	bFadeout = 0;
	return TRUE;
}